

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

int Curl_single_getsock(connectdata *conn,curl_socket_t *sock,int numsocks)

{
  _func_int_connectdata_ptr_curl_socket_t_ptr_int *UNRECOVERED_JUMPTABLE;
  SessionHandle *pSVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  UNRECOVERED_JUMPTABLE = conn->handler->perform_getsock;
  if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr_int *)0x0) {
    iVar2 = (*UNRECOVERED_JUMPTABLE)(conn,sock,numsocks);
    return iVar2;
  }
  uVar3 = 0;
  if (1 < numsocks) {
    pSVar1 = conn->data;
    uVar4 = (pSVar1->req).keepon & 0x15;
    if (uVar4 == 1) {
      *sock = conn->sockfd;
    }
    uVar3 = (uint)(uVar4 == 1);
    if (((pSVar1->req).keepon & 0x2aU) == 2) {
      if ((uVar4 != 1) || (uVar5 = 0x10, conn->sockfd != conn->writesockfd)) {
        sock[uVar4 == 1] = conn->writesockfd;
        uVar5 = uVar4 == 1 | 0x10;
      }
      uVar3 = uVar3 | 1 << uVar5;
    }
  }
  return uVar3;
}

Assistant:

int Curl_single_getsock(const struct connectdata *conn,
                        curl_socket_t *sock, /* points to numsocks number
                                                of sockets */
                        int numsocks)
{
  const struct SessionHandle *data = conn->data;
  int bitmap = GETSOCK_BLANK;
  unsigned sockindex = 0;

  if(conn->handler->perform_getsock)
    return conn->handler->perform_getsock(conn, sock, numsocks);

  if(numsocks < 2)
    /* simple check but we might need two slots */
    return GETSOCK_BLANK;

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_RECVBITS) == KEEP_RECV) {

    DEBUGASSERT(conn->sockfd != CURL_SOCKET_BAD);

    bitmap |= GETSOCK_READSOCK(sockindex);
    sock[sockindex] = conn->sockfd;
  }

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_SENDBITS) == KEEP_SEND) {

    if((conn->sockfd != conn->writesockfd) ||
       bitmap == GETSOCK_BLANK) {
      /* only if they are not the same socket and we have a readable
         one, we increase index */
      if(bitmap != GETSOCK_BLANK)
        sockindex++; /* increase index if we need two entries */

      DEBUGASSERT(conn->writesockfd != CURL_SOCKET_BAD);

      sock[sockindex] = conn->writesockfd;
    }

    bitmap |= GETSOCK_WRITESOCK(sockindex);
  }

  return bitmap;
}